

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,FunctionCallStmt *stmt)

{
  undefined1 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  StmtException *this_00;
  string_view sVar4;
  initializer_list<kratos::IRNode_*> __l;
  FunctionCallStmt *local_80;
  string local_78;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_58;
  ostream *local_40;
  allocator<char> local_32;
  allocator_type local_31;
  
  iVar2 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[4])(stmt);
  if (*(int *)(CONCAT44(extraout_var,iVar2) + 0x48) == 2) {
    if (this->generator_->debug == true) {
      (stmt->super_Stmt).super_IRNode.verilog_ln =
           *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
    }
    puVar1 = &(this->stream_).super_stringstream.field_0x10;
    sVar4 = indent(this);
    local_40 = (ostream *)puVar1;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,sVar4._M_str,sVar4._M_len);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::FunctionCallVar,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               &(stmt->var_).super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>
              );
    Stream::var_str_abi_cxx11_
              (&local_78,&this->stream_,
               (Var *)local_58.
                      super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar3,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_58.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish);
    poVar3 = std::operator<<(local_40,";");
    puVar1 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    std::operator<<(poVar3,'\n');
    return;
  }
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Function call statement cannot be used in top level",&local_32);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_80;
  local_80 = stmt;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_58,__l,&local_31);
  StmtException::StmtException(this_00,&local_78,&local_58);
  __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::FunctionCallStmt* stmt) {
    // since this is a statement, we don't allow it has return value
    // need to use it as a function call expr instead
    if (stmt->parent()->ir_node_kind() != IRNodeKind::StmtKind) {
        throw StmtException("Function call statement cannot be used in top level", {stmt});
    }
    if (generator_->debug) stmt->verilog_ln = stream_.line_no();
    stream_ << indent() << stream_.var_str(stmt->var());

    stream_ << ";" << stream_.endl();
}